

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void in_memory_snapshot_test(void)

{
  fdb_seqnum_t fVar1;
  void *pvVar2;
  fdb_doc *pfVar3;
  void *pvVar4;
  fdb_doc *doc;
  fdb_status fVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  char *__format;
  long lVar11;
  fdb_kvs_handle *db;
  fdb_kvs_handle *snap_db;
  fdb_file_handle *dbfile;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_seqnum_t local_528;
  fdb_kvs_info kvs_info;
  fdb_kvs_config kvs_config;
  fdb_doc *apfStack_4d8 [20];
  timeval __test_begin;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.compaction_threshold = '\0';
  system("rm -rf  mvcc_test* > errorlog.txt");
  fVar5 = fdb_open(&dbfile,"./mvcc_test1",&fconfig);
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x3a3);
    in_memory_snapshot_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x3a3,"void in_memory_snapshot_test()");
  }
  fVar5 = fdb_kvs_open_default(dbfile,&db,&kvs_config);
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x3a5);
    in_memory_snapshot_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x3a5,"void in_memory_snapshot_test()");
  }
  fVar5 = fdb_snapshot_open(db,&snap_db,0);
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x3a9);
    in_memory_snapshot_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x3a9,"void in_memory_snapshot_test()");
  }
  fdb_get_kvs_info(snap_db,&kvs_info);
  if (kvs_info.last_seqnum != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
           );
    in_memory_snapshot_test()::__test_pass = '\x01';
    if (kvs_info.last_seqnum != 0) {
      __assert_fail("kvs_info.last_seqnum == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x3ac,"void in_memory_snapshot_test()");
    }
  }
  fdb_iterator_init(snap_db,&iterator,(void *)0x0,0,(void *)0x0,0,0);
  fVar5 = fdb_iterator_get(iterator,&rdoc);
  if (fVar5 == FDB_RESULT_ITERATOR_FAIL) {
    fdb_iterator_close(iterator);
    fdb_kvs_close(snap_db);
    lVar11 = 0;
    for (uVar10 = 0; uVar10 != 5; uVar10 = uVar10 + 1) {
      sprintf(keybuf,"key%d",uVar10 & 0xffffffff);
      sprintf(metabuf,"meta%d",uVar10 & 0xffffffff);
      sprintf(bodybuf,"body%d",uVar10 & 0xffffffff);
      sVar7 = strlen(keybuf);
      sVar8 = strlen(metabuf);
      sVar9 = strlen(bodybuf);
      fdb_doc_create((fdb_doc **)((long)apfStack_4d8 + lVar11),keybuf,sVar7,metabuf,sVar8,bodybuf,
                     sVar9);
      fdb_set(db,apfStack_4d8[uVar10]);
      lVar11 = lVar11 + 8;
    }
    fdb_commit(dbfile,'\x01');
    lVar11 = 0x28;
    for (uVar10 = 5; uVar10 != 9; uVar10 = uVar10 + 1) {
      sprintf(keybuf,"key%d",uVar10 & 0xffffffff);
      sprintf(metabuf,"meta%d",uVar10 & 0xffffffff);
      sprintf(bodybuf,"body%d",uVar10 & 0xffffffff);
      sVar7 = strlen(keybuf);
      sVar8 = strlen(metabuf);
      sVar9 = strlen(bodybuf);
      fdb_doc_create((fdb_doc **)((long)apfStack_4d8 + lVar11),keybuf,sVar7,metabuf,sVar8,bodybuf,
                     sVar9);
      fdb_set(db,apfStack_4d8[uVar10]);
      lVar11 = lVar11 + 8;
    }
    sprintf(keybuf,"key%d",9);
    sprintf(metabuf,"meta%d",9);
    sprintf(bodybuf,"Body%d",9);
    sVar7 = strlen(keybuf);
    sVar8 = strlen(metabuf);
    sVar9 = strlen(bodybuf);
    fdb_doc_create(apfStack_4d8 + 9,keybuf,sVar7,metabuf,sVar8,bodybuf,sVar9);
    fdb_set(db,apfStack_4d8[9]);
    fdb_commit(dbfile,'\0');
    *(undefined1 *)apfStack_4d8[9]->body = 0x62;
    fdb_set(db,apfStack_4d8[9]);
    fVar1 = apfStack_4d8[9]->seqnum;
    fdb_get_kvs_info(db,&kvs_info);
    fVar5 = fdb_snapshot_open(db,&snap_db,kvs_info.last_seqnum);
    if (fVar5 != FDB_RESULT_NO_DB_INSTANCE) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x3e5);
      in_memory_snapshot_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_NO_DB_INSTANCE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x3e5,"void in_memory_snapshot_test()");
    }
    local_528 = fVar1;
    fVar5 = fdb_snapshot_open(db,&snap_db,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x3eb);
      in_memory_snapshot_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x3eb,"void in_memory_snapshot_test()");
    }
    fdb_commit(dbfile,'\0');
    fdb_set(db,apfStack_4d8[9]);
    fdb_commit(dbfile,'\0');
    lVar11 = 0x50;
    for (uVar10 = 10; uVar10 != 0xf; uVar10 = uVar10 + 1) {
      sprintf(keybuf,"key%d",uVar10 & 0xffffffff);
      sprintf(metabuf,"meta%d",uVar10 & 0xffffffff);
      sprintf(bodybuf,"body%d",uVar10 & 0xffffffff);
      sVar7 = strlen(keybuf);
      sVar8 = strlen(metabuf);
      sVar9 = strlen(bodybuf);
      fdb_doc_create((fdb_doc **)((long)apfStack_4d8 + lVar11),keybuf,sVar7,metabuf,sVar8,bodybuf,
                     sVar9);
      fdb_set(db,apfStack_4d8[uVar10]);
      lVar11 = lVar11 + 8;
    }
    fVar5 = fdb_set_log_callback(db,logCallbackFunc,"in_memory_snapshot_test");
    if (fVar5 == FDB_RESULT_SUCCESS) {
      fdb_get_kvs_info(snap_db,&kvs_info);
      fVar1 = local_528;
      if (kvs_info.last_seqnum != local_528) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
               );
        in_memory_snapshot_test()::__test_pass = '\x01';
        if (kvs_info.last_seqnum != fVar1) {
          __assert_fail("kvs_info.last_seqnum == snap_seq",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x406,"void in_memory_snapshot_test()");
        }
      }
      lVar11 = 0x78;
      for (uVar10 = 0xf; uVar10 != 0x14; uVar10 = uVar10 + 1) {
        sprintf(keybuf,"key%d",uVar10 & 0xffffffff);
        sprintf(metabuf,"meta%d",uVar10 & 0xffffffff);
        sprintf(bodybuf,"body%d",uVar10 & 0xffffffff);
        sVar7 = strlen(keybuf);
        sVar8 = strlen(metabuf);
        sVar9 = strlen(bodybuf);
        fdb_doc_create((fdb_doc **)((long)apfStack_4d8 + lVar11),keybuf,sVar7,metabuf,sVar8,bodybuf,
                       sVar9);
        fdb_set(db,apfStack_4d8[uVar10]);
        lVar11 = lVar11 + 8;
      }
      lVar11 = 0;
      fdb_commit(dbfile,'\0');
      fdb_iterator_init(snap_db,&iterator,(void *)0x0,0,(void *)0x0,0,0);
      rdoc = (fdb_doc *)0x0;
      while( true ) {
        fVar5 = fdb_iterator_get(iterator,&rdoc);
        doc = rdoc;
        if (fVar5 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x41d);
          in_memory_snapshot_test()::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x41d,"void in_memory_snapshot_test()");
        }
        pvVar2 = rdoc->key;
        pfVar3 = apfStack_4d8[lVar11];
        pvVar4 = pfVar3->key;
        iVar6 = bcmp(pvVar2,pvVar4,rdoc->keylen);
        if (iVar6 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pvVar2,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x41f);
          in_memory_snapshot_test()::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x41f,"void in_memory_snapshot_test()");
        }
        pvVar2 = doc->meta;
        pvVar4 = pfVar3->meta;
        iVar6 = bcmp(pvVar2,pvVar4,doc->metalen);
        if (iVar6 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pvVar2,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x420);
          in_memory_snapshot_test()::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x420,"void in_memory_snapshot_test()");
        }
        pvVar2 = doc->body;
        pvVar4 = pfVar3->body;
        iVar6 = bcmp(pvVar2,pvVar4,doc->bodylen);
        if (iVar6 != 0) break;
        fdb_doc_free(doc);
        rdoc = (fdb_doc *)0x0;
        lVar11 = lVar11 + 1;
        fVar5 = fdb_iterator_next(iterator);
        if (fVar5 == FDB_RESULT_ITERATOR_FAIL) {
          if ((int)lVar11 == 10) {
            fdb_iterator_close(iterator);
            fdb_kvs_close(db);
            fdb_kvs_close(snap_db);
            fdb_close(dbfile);
            for (lVar11 = 0; lVar11 != 0x14; lVar11 = lVar11 + 1) {
              fdb_doc_free(apfStack_4d8[lVar11]);
            }
            fdb_shutdown();
            memleak_end();
            __format = "%s PASSED\n";
            if (in_memory_snapshot_test()::__test_pass != '\0') {
              __format = "%s FAILED\n";
            }
            fprintf(_stderr,__format,"in-memory snapshot test");
            return;
          }
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x429);
          in_memory_snapshot_test()::__test_pass = 1;
          __assert_fail("count==n/2",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x429,"void in_memory_snapshot_test()");
        }
      }
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar4,pvVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x421);
      in_memory_snapshot_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x421,"void in_memory_snapshot_test()");
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x402);
    in_memory_snapshot_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x402,"void in_memory_snapshot_test()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x3b1);
  in_memory_snapshot_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x3b1,"void in_memory_snapshot_test()");
}

Assistant:

void in_memory_snapshot_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 20;
    int count;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_handle *snap_db;
    fdb_seqnum_t snap_seq;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_kvs_info kvs_info;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // open db
    status = fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create a snapshot from an empty database file
    status = fdb_snapshot_open(db, &snap_db, 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // check if snapshot's sequence number is zero.
    fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == 0);
    // create an iterator on the snapshot for full range
    fdb_iterator_init(snap_db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    // Iterator should not return any items.
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(iterator);
    fdb_kvs_close(snap_db);

    // ------- Setup test ----------------------------------
    // insert documents of 0-4
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 5 - 8
    for (; i < n/2 - 1; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // We want to create:
    // |WALFlushHDR|Key-Value1|HDR|Key-Value2|SnapshotHDR|Key-Value1|HDR|
    // Insert doc 9 with a different value to test duplicate elimination..
    sprintf(keybuf, "key%d", i);
    sprintf(metabuf, "meta%d", i);
    sprintf(bodybuf, "Body%d", i);
    fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
    fdb_set(db, doc[i]);

    // commit again without a WAL flush (last doc goes into the AVL tree)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // Insert doc 9 now again with expected value..
    *(char *)doc[i]->body = 'b';
    fdb_set(db, doc[i]);

    // TAKE SNAPSHOT: pick up sequence number of a commit without a WAL flush
    snap_seq = doc[i]->seqnum;

    // Creation of a snapshot with a sequence number that was taken WITHOUT a
    // commit must fail even if it from the latest document that was set...
    fdb_get_kvs_info(db, &kvs_info);
    status = fdb_snapshot_open(db, &snap_db, kvs_info.last_seqnum);
    TEST_CHK(status == FDB_RESULT_NO_DB_INSTANCE);

    // ---------- Snapshot tests begin -----------------------
    // Initialize an in-memory snapshot Without a Commit...
    // WAL items are not flushed...
    status = fdb_snapshot_open(db, &snap_db, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // commit again without a WAL flush (these documents go into the AVL trees)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // Now re-insert doc 9 as another duplicate (only newer sequence number)
    fdb_set(db, doc[i]);

    // commit again without a WAL flush (last doc goes into the AVL tree)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert documents from 10-14 into HB-trie
    for (++i; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "in_memory_snapshot_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // check snapshot's sequence number
    fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == snap_seq);

    // insert documents from 15 - 19 on file into the WAL
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // commit without a WAL flush (This WAL must not affect snapshot)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // create an iterator on the snapshot for full range
    fdb_iterator_init(snap_db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);

    // repeat until fail
    i=0;
    count=0;
    rdoc = NULL;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);

    TEST_CHK(count==n/2); // Only unique items from the first half

    fdb_iterator_close(iterator);

    // close db handle
    fdb_kvs_close(db);
    // close snapshot handle
    fdb_kvs_close(snap_db);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("in-memory snapshot test");
}